

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O3

void __thiscall CGL::HDRImageBuffer::HDRImageBuffer(HDRImageBuffer *this,size_t w,size_t h)

{
  this->w = w;
  this->h = h;
  (this->data).super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data).super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data).super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>::resize(&this->data,w * h);
  return;
}

Assistant:

HDRImageBuffer(size_t w, size_t h) : w(w), h(h) { data.resize(w * h); }